

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O3

LY_ERR json_print_node(jsonpr_ctx *pctx,lyd_node *node)

{
  ushort uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  lysc_node *plVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  lyd_node *plVar8;
  ly_bool lVar9;
  LY_ERR LVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint32_t *opts;
  lys_module *plVar14;
  lyd_node_opaq *onode2_1;
  ulong uVar15;
  lys_module *plVar16;
  lyd_node_opaq *plVar17;
  char *pcVar18;
  lyd_node_opaq *onode1_1;
  ly_out *out;
  char cVar19;
  char *pcVar20;
  lyd_node_opaq *onode2;
  lyd_node_opaq *node_00;
  lyd_node_opaq *plVar21;
  lyd_meta *plVar22;
  bool bVar23;
  lyd_node *local_50;
  lys_module *local_48;
  lyd_node_opaq *local_40;
  uint32_t local_34;
  
  lVar9 = lyd_node_should_print(node,pctx->options);
  if (lVar9 == '\0') {
    lVar9 = json_print_array_is_last_inst(pctx,node);
    if (lVar9 == '\0') {
      return LY_SUCCESS;
    }
    json_print_array_close(pctx);
    return LY_SUCCESS;
  }
  plVar4 = node->schema;
  if (plVar4 == (lysc_node *)0x0) {
    uVar12 = 0;
    uVar13 = *(uint *)&node[1].meta;
    if (*(uint *)&node[1].meta == 0x3f3) {
      uVar13 = uVar12;
    }
    if ((uVar13 & 0x180) == 0) {
LAB_0013cee2:
      cVar19 = (char)uVar12;
      LVar10 = json_print_member2(pctx,pctx->parent,*(LY_VALUE_FORMAT *)((long)&node[1].meta + 4),
                                  (ly_opaq_name *)&node[1].schema,'\0');
      if (LVar10 != LY_SUCCESS) {
        return LVar10;
      }
      if (((uVar13 & 0x180) != 0) &&
         (LVar10 = json_print_array_open(pctx,node), LVar10 != LY_SUCCESS)) {
        return LVar10;
      }
      if ((uVar13 >> 8 & 1) != 0) {
        uVar15 = 0;
        if ((pctx->options & 2) == 0) {
          uVar15 = (ulong)((uint)pctx->level * 2);
        }
        ly_print_(pctx->out,"%*s",uVar15,"");
      }
    }
    else {
      plVar8 = node->prev;
      if ((((plVar8->next == (lyd_node *)0x0) || (plVar8->schema != (lysc_node *)0x0)) ||
          (plVar8[1].schema != node[1].schema)) || (plVar8[1].parent != node[1].parent)) {
        bVar23 = false;
      }
      else {
        bVar23 = true;
      }
      plVar8 = node->next;
      if (((plVar8 == (lyd_node *)0x0) || (plVar8->schema != (lysc_node *)0x0)) ||
         ((node[1].schema != plVar8[1].schema || (node[1].parent != plVar8[1].parent)))) {
        uVar12 = 0;
      }
      else {
        uVar12 = 1;
      }
      cVar19 = (char)uVar12;
      if (!bVar23) goto LAB_0013cee2;
      if ((uVar13 >> 8 & 1) != 0) {
        uVar15 = 0;
        pcVar20 = "";
        if ((pctx->options & 2) == 0) {
          pcVar20 = "\n";
          uVar15 = (ulong)((uint)pctx->level * 2);
        }
        ly_print_(pctx->out,",%s%*s",pcVar20,uVar15,"");
      }
    }
    if (((uVar13 & 0x280) == 0) &&
       (lVar5._0_4_ = node[1].hash, lVar5._4_4_ = node[1].flags, lVar5 == 0)) {
      if ((uVar13 & 0x40) == 0) {
        if ((char)((uVar13 & 0x10) >> 4) == '\0' && (uVar13 & 0x22) != 0) {
          ly_print_(pctx->out,"%s");
        }
        else {
          json_print_string(pctx->out,(char *)node[1].prev);
        }
      }
      else {
        ly_print_(pctx->out,"[null]");
      }
      pctx->level_printed = pctx->level;
      if ((uVar13 >> 8 & 1) == 0) {
        json_print_attributes(pctx,node,'\0');
      }
      else if ((pctx->first_leaflist == (lyd_node *)0x0) &&
              (lVar6._0_4_ = node[2].hash, lVar6._4_4_ = node[2].flags, lVar6 != 0)) {
        pctx->first_leaflist = node;
      }
    }
    else {
      LVar10 = json_print_inner(pctx,node);
      if (LVar10 != LY_SUCCESS) {
        return LVar10;
      }
      pctx->level_printed = pctx->level;
    }
    if ((uVar13 & 0x180) != 0 && cVar19 == '\0') goto LAB_0013d2e0;
  }
  else {
    uVar1 = plVar4->nodetype;
    if (uVar1 < 0x20) {
      if (uVar1 < 8) {
        if (uVar1 != 1) {
          if (uVar1 != 4) goto LAB_0013d0e3;
          json_print_member(pctx,node,'\0');
          if (node->schema == (lysc_node *)0x0) {
            plVar14 = (lys_module *)&node[2].schema;
            plVar16 = _DAT_00000008;
          }
          else {
            plVar14 = node->schema->module;
            plVar16 = plVar14;
          }
          LVar10 = json_print_value(pctx,plVar14->ctx,(lyd_value *)(node + 1),plVar16);
          if (LVar10 != LY_SUCCESS) {
            return LVar10;
          }
          goto switchD_0013d187_default;
        }
        goto LAB_0013cf9e;
      }
      if ((uVar1 != 8) && (uVar1 != 0x10)) goto LAB_0013d0e3;
      uVar3 = (pctx->open).count;
      if ((uVar3 == 0) ||
         ((plVar8 = (pctx->open).field_2.dnodes[uVar3 - 1], plVar8 == (lyd_node *)0x0 ||
          (plVar4 != plVar8->schema)))) {
        json_print_member(pctx,node,'\0');
        LVar10 = json_print_array_open(pctx,node);
        if (LVar10 != LY_SUCCESS) {
          return LVar10;
        }
        if (node->schema->nodetype == 8) {
          uVar15 = 0;
          if ((pctx->options & 2) == 0) {
            uVar15 = (ulong)((uint)pctx->level * 2);
          }
          ly_print_(pctx->out,"%*s",uVar15,"");
        }
      }
      else if (uVar1 == 8) {
        uVar15 = 0;
        pcVar20 = "";
        if ((pctx->options & 2) == 0) {
          pcVar20 = "\n";
          uVar15 = (ulong)((uint)pctx->level * 2);
        }
        ly_print_(pctx->out,",%s%*s",pcVar20,uVar15,"");
      }
      uVar2 = node->schema->nodetype;
      if (uVar2 == 8) {
        plVar14 = node->schema->module;
        LVar10 = json_print_value(pctx,plVar14->ctx,(lyd_value *)(node + 1),plVar14);
        if (LVar10 != LY_SUCCESS) {
          return LVar10;
        }
        if (pctx->first_leaflist == (lyd_node *)0x0) {
          if (((pctx->options & 0xc0) != 0 && (node->flags & 1) != 0) ||
             (((pctx->options & 0x40) != 0 && (lVar9 = lyd_is_default(node), lVar9 != '\0')))) {
            if (node->schema == (lysc_node *)0x0) {
              plVar14 = (lys_module *)&node[2].schema;
            }
            else {
              plVar14 = node->schema->module;
            }
            plVar14 = ly_ctx_get_module_implemented(plVar14->ctx,"ietf-netconf-with-defaults");
            if (plVar14 != (lys_module *)0x0) {
LAB_0013d787:
              pctx->first_leaflist = node;
              goto LAB_0013d78b;
            }
          }
          for (plVar22 = node->meta; plVar22 != (lyd_meta *)0x0; plVar22 = plVar22->next) {
            lVar9 = lyd_metadata_should_print(plVar22);
            if (lVar9 != '\0') goto LAB_0013d787;
          }
        }
      }
      else {
        if (uVar2 != 0x10) {
          __assert_fail("node->schema->nodetype == LYS_LEAFLIST",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_json.c"
                        ,0x332,
                        "LY_ERR json_print_leaf_list(struct jsonpr_ctx *, const struct lyd_node *)")
          ;
        }
        LVar10 = json_print_inner(pctx,node);
        if (LVar10 != LY_SUCCESS) {
          return LVar10;
        }
      }
LAB_0013d78b:
      lVar9 = json_print_array_is_last_inst(pctx,node);
      if (lVar9 == '\0') goto LAB_0013d45e;
LAB_0013d2e0:
      json_print_array_close(pctx);
    }
    else if (uVar1 < 0x100) {
      if ((uVar1 != 0x20) && (uVar1 != 0x60)) goto LAB_0013d0e3;
      json_print_member(pctx,node,'\0');
      local_34 = 0;
      uVar1 = node->schema->nodetype;
      if ((uVar1 & 0x60) == 0) {
        __assert_fail("any->schema->nodetype & LYD_NODE_ANY",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_json.c"
                      ,0x244,
                      "LY_ERR json_print_any_content(struct jsonpr_ctx *, struct lyd_node_any *)");
      }
      iVar11 = *(int *)&node[1].schema;
      if (uVar1 == 0x60) {
        if (iVar11 != 0) {
          ly_log(pctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_json.c"
                 ,0x247);
          return LY_EINT;
        }
switchD_0013d187_caseD_0:
        pcVar20 = "";
        if ((pctx->options & 2) == 0) {
          pcVar20 = "\n";
        }
        ly_print_(pctx->out,"{%s",pcVar20);
        uVar13 = *(uint *)&pctx->level;
        pctx->level = (short)uVar13 + 1;
        plVar8 = pctx->parent;
        uVar12 = pctx->options;
        pctx->parent = node;
        pctx->options = uVar12 & 0xfffffffe;
        local_50 = *(lyd_node **)(node + 1);
        if (local_50 != (lyd_node *)0x0) {
          do {
            LVar10 = json_print_node(pctx,local_50);
            if (LVar10 != LY_SUCCESS) {
              pctx->level = pctx->level - 1;
              return LVar10;
            }
            local_50 = local_50->next;
          } while (local_50 != (lyd_node *)0x0);
          uVar13 = *(int *)&pctx->level - 1;
          local_50 = (lyd_node *)0x0;
        }
        pctx->parent = plVar8;
        pctx->options = uVar12;
        pctx->level = (uint16_t)uVar13;
        out = pctx->out;
        if ((uVar12 & 2) == 0) {
          ly_print_(out,"\n%*s}",(ulong)((uVar13 & 0xffff) * 2),"");
        }
        else {
          pcVar20 = "}";
LAB_0013d442:
          ly_print_(out,pcVar20);
        }
      }
      else {
        if (iVar11 == 4) {
          opts = ly_temp_log_options(&local_34);
          LVar10 = lyd_parse_data_mem(pctx->ctx,*(char **)(node + 1),LYD_LYB,0x70000,0,&local_50);
          if (LVar10 == LY_SUCCESS) {
            free(*(void **)(node + 1));
            *(lyd_node **)(node + 1) = local_50;
            *(undefined4 *)&node[1].schema = 0;
          }
          ly_temp_log_options(opts);
          iVar11 = *(int *)&node[1].schema;
        }
        switch(iVar11) {
        case 0:
          goto switchD_0013d187_caseD_0;
        case 1:
        case 2:
          if (*(char **)(node + 1) != (char *)0x0) {
            json_print_string(pctx->out,*(char **)(node + 1));
            break;
          }
LAB_0013d416:
          out = pctx->out;
          if (node->schema->nodetype == 0x20) {
            pcVar20 = "null";
          }
          else {
            pcVar20 = "{}";
          }
          goto LAB_0013d442;
        case 3:
          lVar7._0_4_ = node[1].hash;
          lVar7._4_4_ = node[1].flags;
          if (lVar7 == 0) goto LAB_0013d416;
          ly_print_(pctx->out,"%s");
          break;
        case 4:
          ly_log(pctx->ctx,LY_LLWRN,LY_SUCCESS,"Unable to print anydata content (type %d) as JSON.",
                 4);
        }
      }
switchD_0013d187_default:
      pctx->level_printed = pctx->level;
      json_print_attributes(pctx,node,'\0');
    }
    else {
      if (((uVar1 != 0x100) && (uVar1 != 0x400)) && (uVar1 != 0x200)) {
LAB_0013d0e3:
        ly_log(pctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_json.c"
               ,0x3fe);
        return LY_EMEM;
      }
LAB_0013cf9e:
      json_print_member(pctx,node,'\0');
      LVar10 = json_print_inner(pctx,node);
      if (LVar10 != LY_SUCCESS) {
        return LVar10;
      }
    }
  }
LAB_0013d45e:
  pctx->level_printed = pctx->level;
  node_00 = (lyd_node_opaq *)pctx->first_leaflist;
  if (node_00 == (lyd_node_opaq *)0x0) {
    return LY_SUCCESS;
  }
  plVar8 = node->next;
  if ((plVar8 != (lyd_node *)0x0) && (plVar8->schema == (node_00->field_0).node.schema)) {
    if (plVar8->schema != (lysc_node *)0x0) {
      return LY_SUCCESS;
    }
    if ((plVar8[1].schema == (lysc_node *)(node_00->name).name) &&
       (plVar8[1].parent == (lyd_node_inner *)(node_00->name).prefix)) {
      return LY_SUCCESS;
    }
  }
  if ((pctx->options & 0xc0) == 0) {
    local_48 = (lys_module *)0x0;
  }
  else {
    local_48 = ly_ctx_get_module_implemented(pctx->ctx,"ietf-netconf-with-defaults");
    node_00 = (lyd_node_opaq *)pctx->first_leaflist;
  }
  plVar21 = (lyd_node_opaq *)(node_00->field_0).node.prev;
  if ((plVar21->field_0).node.next != (lyd_node *)0x0) {
    plVar4 = (node_00->field_0).node.schema;
    while (plVar17 = plVar21, plVar4 == (plVar17->field_0).node.schema) {
      if (((plVar4 == (lysc_node *)0x0) &&
          (((node_00->name).name != (plVar17->name).name ||
           ((node_00->name).prefix != (plVar17->name).prefix)))) ||
         (plVar21 = (lyd_node_opaq *)(plVar17->field_0).node.prev, node_00 = plVar17,
         (plVar21->field_0).node.next == (lyd_node *)0x0)) break;
    }
  }
  if ((node_00->field_0).node.schema == (lysc_node *)0x0) {
    LVar10 = json_print_member2(pctx,(lyd_node *)(node_00->field_0).node.parent,node_00->format,
                                &node_00->name,'\x01');
    local_40 = node_00;
    if (LVar10 != LY_SUCCESS) goto LAB_0013d731;
  }
  else {
    json_print_member(pctx,(lyd_node *)node_00,'\x01');
    local_40 = (lyd_node_opaq *)0x0;
  }
  pcVar20 = "\n";
  pcVar18 = "";
  if ((pctx->options & 2) == 0) {
    pcVar18 = "\n";
  }
  ly_print_(pctx->out,"[%s",pcVar18);
  uVar12 = *(int *)&pctx->level + 1;
  pctx->level = (uint16_t)uVar12;
  uVar13 = (uint)pctx->level_printed;
  do {
    plVar21 = node_00;
    if ((ushort)uVar12 <= (ushort)uVar13) {
      pcVar18 = "";
      if ((pctx->options & 2) == 0) {
        pcVar18 = "\n";
      }
      ly_print_(pctx->out,",%s",pcVar18);
    }
    if (((plVar21->field_0).node.schema == (lysc_node *)0x0) ||
       ((plVar14 = local_48,
        (undefined1  [56])((undefined1  [56])plVar21->field_0 & (undefined1  [56])0x100000000) ==
        (undefined1  [56])0x0 &&
        (((pctx->options & 0x40) == 0 ||
         (lVar9 = lyd_is_default((lyd_node *)plVar21), plVar14 = local_48, lVar9 == '\0')))))) {
      plVar14 = (lys_module *)0x0;
    }
    if ((plVar21->field_0).node.schema == (lysc_node *)0x0) {
LAB_0013d5c7:
      if ((local_40 != (lyd_node_opaq *)0x0) && (local_40->attr != (lyd_attr *)0x0))
      goto LAB_0013d5db;
      uVar15 = 0;
      if ((pctx->options & 2) == 0) {
        uVar15 = (ulong)((uint)pctx->level * 2);
      }
      ly_print_(pctx->out,"%*snull",uVar15,"");
    }
    else {
      for (plVar22 = (plVar21->field_0).node.meta; plVar22 != (lyd_meta *)0x0;
          plVar22 = plVar22->next) {
        lVar9 = lyd_metadata_should_print(plVar22);
        if (lVar9 != '\0') goto LAB_0013d5db;
      }
      if (plVar14 == (lys_module *)0x0) goto LAB_0013d5c7;
LAB_0013d5db:
      uVar15 = 0;
      pcVar18 = "{";
      if ((pctx->options & 2) == 0) {
        uVar15 = (ulong)((uint)pctx->level * 2);
        pcVar18 = "{\n";
      }
      ly_print_(pctx->out,"%*s%s",uVar15,"",pcVar18);
      pctx->level = pctx->level + 1;
      if ((plVar21->field_0).node.schema == (lysc_node *)0x0) {
        json_print_attribute(pctx,plVar21);
      }
      else {
        LVar10 = json_print_metadata(pctx,(lyd_node *)plVar21,plVar14);
        if (LVar10 != LY_SUCCESS) goto LAB_0013d731;
      }
      uVar13 = *(int *)&pctx->level - 1;
      pctx->level = (uint16_t)uVar13;
      bVar23 = (pctx->options & 2) == 0;
      pcVar18 = "";
      if (bVar23) {
        pcVar18 = "\n";
      }
      uVar13 = (uVar13 & 0xffff) * 2;
      if (!bVar23) {
        uVar13 = 0;
      }
      ly_print_(pctx->out,"%s%*s}",pcVar18,(ulong)uVar13,"");
    }
    uVar12 = (uint)pctx->level;
    pctx->level_printed = pctx->level;
    node_00 = (lyd_node_opaq *)(plVar21->field_0).node.next;
  } while (((node_00 != (lyd_node_opaq *)0x0) &&
           (plVar4 = (plVar21->field_0).node.schema, plVar4 == (node_00->field_0).node.schema)) &&
          ((uVar13 = uVar12, plVar4 != (lysc_node *)0x0 ||
           (((plVar21->name).name == (node_00->name).name &&
            ((plVar21->name).prefix == (node_00->name).prefix))))));
  pctx->level = (uint16_t)(uVar12 - 1);
  uVar13 = (uVar12 - 1 & 0xffff) * 2;
  if ((pctx->options & 2) != 0) {
    pcVar20 = "";
    uVar13 = 0;
  }
  ly_print_(pctx->out,"%s%*s]",pcVar20,(ulong)uVar13,"");
  pctx->level_printed = pctx->level;
LAB_0013d731:
  pctx->first_leaflist = (lyd_node *)0x0;
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
json_print_node(struct jsonpr_ctx *pctx, const struct lyd_node *node)
{
    if (!lyd_node_should_print(node, pctx->options)) {
        if (json_print_array_is_last_inst(pctx, node)) {
            json_print_array_close(pctx);
        }
        return LY_SUCCESS;
    }

    if (!node->schema) {
        LY_CHECK_RET(json_print_opaq(pctx, (const struct lyd_node_opaq *)node));
    } else {
        switch (node->schema->nodetype) {
        case LYS_RPC:
        case LYS_ACTION:
        case LYS_NOTIF:
        case LYS_CONTAINER:
            LY_CHECK_RET(json_print_container(pctx, node));
            break;
        case LYS_LEAF:
            LY_CHECK_RET(json_print_leaf(pctx, node));
            break;
        case LYS_LEAFLIST:
        case LYS_LIST:
            LY_CHECK_RET(json_print_leaf_list(pctx, node));
            break;
        case LYS_ANYDATA:
        case LYS_ANYXML:
            LY_CHECK_RET(json_print_any(pctx, node));
            break;
        default:
            LOGINT(pctx->ctx);
            return EXIT_FAILURE;
        }
    }

    pctx->level_printed = pctx->level;

    if (pctx->first_leaflist && !matching_node(node->next, pctx->first_leaflist)) {
        json_print_meta_attr_leaflist(pctx);
        pctx->first_leaflist = NULL;
    }

    return LY_SUCCESS;
}